

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minimize_constraint.cpp
# Opt level: O0

void __thiscall Clasp::UncoreMinimize::Todo::shrinkPush(Todo *this,UncoreMinimize *self,Solver *s)

{
  uint uVar1;
  bool bVar2;
  uint32 uVar3;
  reference pLVar4;
  iterator pLVar5;
  size_type sVar6;
  UncoreMinimize *in_RDX;
  Literal *in_RSI;
  pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
  *in_RDI;
  LitPair *x;
  const_iterator it;
  uint32 n;
  uint32 skip;
  byte local_45;
  uint32 local_44;
  iterator pLVar7;
  size_type sVar8;
  
  uVar1 = in_RDI[1].ebo_.cap;
  uVar3 = sizeVec<bk_lib::pod_vector<Clasp::UncoreMinimize::LitPair,std::allocator<Clasp::UncoreMinimize::LitPair>>>
                    ((pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
                      *)0x1b626d);
  if (uVar1 < uVar3) {
    pLVar4 = bk_lib::
             pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
             ::operator[](in_RDI + 2,in_RDI[1].ebo_.cap);
    local_44 = pLVar4->id;
  }
  else {
    local_44 = 0;
  }
  sVar8 = in_RDI[1].ebo_.size;
  pLVar5 = bk_lib::
           pod_vector<Clasp::UncoreMinimize::LitPair,_std::allocator<Clasp::UncoreMinimize::LitPair>_>
           ::end(in_RDI);
  do {
    sVar6 = sVar8 - 1;
    if (sVar8 == 0) {
      return;
    }
    pLVar7 = pLVar5 + -1;
    local_45 = 0;
    if (pLVar5[-1].id != local_44) {
      Literal::operator~(in_RSI);
      bVar2 = UncoreMinimize::push
                        (in_RDX,(Solver *)CONCAT44(local_44,sVar6),(Literal)(uint32)in_RSI,
                         (uint32)((ulong)pLVar7 >> 0x20));
      local_45 = bVar2 ^ 0xff;
    }
    pLVar5 = pLVar7;
    sVar8 = sVar6;
  } while ((local_45 & 1) == 0);
  return;
}

Assistant:

void UncoreMinimize::Todo::shrinkPush(UncoreMinimize& self, Solver& s) {
	const uint32 skip = step_ < sizeVec(core_) ? core_[step_].id : 0u;
	uint32 n = next_;
	for (Todo::const_iterator it = lits_.end(); n--;) {
		const LitPair& x = *--it;
		if (x.id != skip && !self.push(s, ~x.lit, x.id)) {
			break;
		}
	}
}